

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GetterXsYs<unsigned_char> *pGVar4;
  GetterXsYRef<unsigned_char> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  float fVar8;
  undefined1 auVar9 [12];
  int iVar10;
  long lVar11;
  ImDrawIdx IVar12;
  ushort uVar13;
  ImPlotContext *gp;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ImVec2 IVar19;
  double dVar20;
  ImVec2 IVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar34 [16];
  
  pGVar4 = this->Getter1;
  pGVar5 = this->Getter2;
  iVar10 = pGVar4->Count;
  lVar11 = (long)(((pGVar4->Offset + prim + 1) % iVar10 + iVar10) % iVar10) * (long)pGVar4->Stride;
  iVar10 = this->Transformer->YAxis;
  iVar3 = pGVar5->Count;
  IVar19 = GImPlot->PixelRange[iVar10].Min;
  dVar20 = (double)IVar19.x;
  dVar22 = (double)IVar19.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar10].Range.Min;
  IVar19.x = (float)(((double)pGVar4->Xs[lVar11] - dVar1) * GImPlot->Mx + dVar20);
  IVar19.y = (float)(((double)pGVar4->Ys[lVar11] - dVar2) * GImPlot->My[iVar10] + dVar22);
  IVar21.x = (float)(((double)pGVar5->Xs
                              [(long)(((prim + 1 + pGVar5->Offset) % iVar3 + iVar3) % iVar3) *
                               (long)pGVar5->Stride] - dVar1) * GImPlot->Mx + dVar20);
  IVar21.y = (float)((pGVar5->YRef - dVar2) * GImPlot->My[iVar10] + dVar22);
  fVar8 = (this->P12).x;
  fVar23 = (this->P12).y;
  fVar25 = (this->P11).x;
  fVar26 = (this->P11).y;
  uVar17 = -(uint)(fVar26 < fVar23);
  fVar24 = (float)(~-(uint)(fVar8 <= fVar25) & (uint)fVar8 | (uint)fVar25 & -(uint)(fVar8 <= fVar25)
                  );
  fVar27 = (float)(~-(uint)(fVar23 <= fVar26) & (uint)fVar23 |
                  (uint)fVar26 & -(uint)(fVar23 <= fVar26));
  fVar30 = (float)(~-(uint)(fVar25 < fVar8) & (uint)fVar8 | (uint)fVar25 & -(uint)(fVar25 < fVar8));
  fVar38 = (float)(~uVar17 & (uint)fVar23 | (uint)fVar26 & uVar17);
  uVar14 = -(uint)(IVar19.x <= fVar24);
  uVar15 = -(uint)(IVar19.y <= fVar27);
  uVar16 = -(uint)(fVar30 < IVar19.x);
  uVar18 = -(uint)(fVar38 < IVar19.y);
  fVar24 = (float)(~uVar14 & (uint)IVar19.x | (uint)fVar24 & uVar14);
  fVar27 = (float)(~uVar15 & (uint)IVar19.y | (uint)fVar27 & uVar15);
  fVar30 = (float)(~uVar16 & (uint)IVar19.x | (uint)fVar30 & uVar16);
  fVar38 = (float)(~uVar18 & (uint)IVar19.y | (uint)fVar38 & uVar18);
  uVar14 = -(uint)(IVar21.x <= fVar24);
  uVar15 = -(uint)(IVar21.y <= fVar27);
  uVar16 = -(uint)(fVar30 < IVar21.x);
  uVar18 = -(uint)(fVar38 < IVar21.y);
  auVar29._0_4_ = (uint)fVar24 & uVar14;
  auVar29._4_4_ = (uint)fVar27 & uVar15;
  auVar29._8_4_ = (uint)fVar30 & uVar16;
  auVar29._12_4_ = (uint)fVar38 & uVar18;
  auVar35._0_4_ = ~uVar14 & (uint)IVar21.x;
  auVar35._4_4_ = ~uVar15 & (uint)IVar21.y;
  auVar35._8_4_ = ~uVar16 & (uint)IVar21.x;
  auVar35._12_4_ = ~uVar18 & (uint)IVar21.y;
  auVar35 = auVar35 | auVar29;
  fVar24 = (cull_rect->Min).y;
  auVar37._4_4_ = -(uint)(fVar24 < auVar35._4_4_);
  auVar37._0_4_ = -(uint)((cull_rect->Min).x < auVar35._0_4_);
  auVar9._4_8_ = auVar35._8_8_;
  auVar9._0_4_ = -(uint)(auVar35._4_4_ < fVar24);
  auVar36._0_8_ = auVar9._0_8_ << 0x20;
  auVar36._8_4_ = -(uint)(auVar35._8_4_ < (cull_rect->Max).x);
  auVar36._12_4_ = -(uint)(auVar35._12_4_ < (cull_rect->Max).y);
  auVar37._8_8_ = auVar36._8_8_;
  iVar10 = movmskps((int)cull_rect,auVar37);
  if (iVar10 == 0xf) {
    fVar27 = IVar19.y * fVar25 - fVar26 * IVar19.x;
    fVar30 = IVar21.y * fVar8 - fVar23 * IVar21.x;
    fVar24 = fVar23 - IVar21.y;
    auVar31._4_4_ = fVar24;
    auVar31._0_4_ = fVar24;
    auVar31._8_4_ = fVar24;
    auVar31._12_4_ = fVar24;
    auVar32._4_12_ = auVar31._4_12_;
    auVar32._0_4_ = fVar24 * (fVar25 - IVar19.x) - (fVar26 - IVar19.y) * (fVar8 - IVar21.x);
    auVar28._0_4_ = fVar27 * (fVar8 - IVar21.x) - fVar30 * (fVar25 - IVar19.x);
    auVar28._4_4_ = fVar27 * fVar24 - fVar30 * (fVar26 - IVar19.y);
    auVar28._8_4_ = IVar19.y * 0.0 - IVar21.y * 0.0;
    auVar28._12_4_ = IVar19.y * 0.0 - IVar21.y * 0.0;
    auVar34._0_8_ = auVar32._0_8_;
    auVar34._8_4_ = fVar24;
    auVar34._12_4_ = fVar24;
    auVar33._8_8_ = auVar34._8_8_;
    auVar33._4_4_ = auVar32._0_4_;
    auVar33._0_4_ = auVar32._0_4_;
    auVar29 = divps(auVar28,auVar33);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    pIVar6[1].pos = IVar19;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar29._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar21;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar14 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar14;
    *pIVar7 = IVar12;
    uVar13 = (byte)((byte)uVar17 & IVar21.y < IVar19.y | -(fVar23 < fVar26) & -(IVar19.y < IVar21.y)
                   ) & 1;
    pIVar7[1] = IVar12 + uVar13 + 1;
    pIVar7[2] = IVar12 + 3;
    pIVar7[3] = IVar12 + 1;
    pIVar7[4] = (uVar13 ^ 3) + IVar12;
    pIVar7[5] = IVar12 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar14 + 5;
  }
  this->P11 = IVar19;
  this->P12 = IVar21;
  return (char)iVar10 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }